

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_nal.c
# Opt level: O2

WORD32 ihevcd_nal_search_start_code(UWORD8 *pu1_buf,WORD32 bytes_remaining)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  iVar5 = 0;
  lVar3 = -1;
  lVar4 = 1;
  do {
    if (bytes_remaining + -1 <= lVar3) {
      bVar1 = pu1_buf[lVar4 + -2] == '\x01';
      if ((1 < iVar5) < (pu1_buf[lVar4 + -2] == '\x01')) {
        bVar1 = 1 < iVar5;
      }
      iVar5 = (int)lVar3 + (uint)bVar1;
LAB_0010e862:
      return iVar5 + 1;
    }
    iVar2 = 0;
    if (pu1_buf[lVar4 + -1] == '\0') {
      if (pu1_buf[lVar4] == '\x01' && 0 < iVar5) {
        iVar5 = (int)lVar4;
        goto LAB_0010e862;
      }
      iVar2 = iVar5 + 1;
    }
    iVar5 = iVar2;
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

WORD32 ihevcd_nal_search_start_code(UWORD8 *pu1_buf, WORD32 bytes_remaining)
{
    WORD32 ofst;

    WORD32 zero_byte_cnt;
    WORD32 start_code_found;

    ofst = -1;

    zero_byte_cnt = 0;
    start_code_found = 0;
    while(ofst < (bytes_remaining - 1))
    {
        ofst++;
        if(pu1_buf[ofst] != 0)
        {
            zero_byte_cnt = 0;
            continue;
        }

        zero_byte_cnt++;
        if((pu1_buf[ofst + 1] == START_CODE_PREFIX_BYTE) &&
           (zero_byte_cnt >= NUM_ZEROS_BEFORE_START_CODE))
        {
            /* Found the start code */
            ofst++;
            start_code_found = 1;
            break;
        }
    }
    if(0 == start_code_found)
    {
        if((START_CODE_PREFIX_BYTE == pu1_buf[ofst]) &&
           (zero_byte_cnt >= NUM_ZEROS_BEFORE_START_CODE))
        {
            /* Found a start code at the end*/
            ofst++;
        }
    }
    /* Since ofst started at -1, increment it by 1 */
    ofst++;

    return ofst;
}